

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSyncTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::Sync::FlushCommandsTest::iterate(FlushCommandsTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar7;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint buffer_dst;
  GLuint buffer_src;
  int local_1d0;
  int local_1cc;
  int *local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((!bVar2) && (!bVar3)) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
    goto LAB_00a2920a;
  }
  local_1cc = 0;
  local_1d0 = 0;
  (**(code **)(lVar6 + 0x3b8))(1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                  ,0x79);
  (**(code **)(lVar6 + 0xec0))(local_1cc,8,iterate::reference,0x88e6);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glNamedBufferData have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                  ,0x7b);
  (**(code **)(lVar6 + 0x3b8))(1,&local_1d0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                  ,0x7e);
  (**(code **)(lVar6 + 0xed8))(local_1d0,8,0,0xc1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glNamedBufferStorage have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                  ,0x81);
  local_1c8 = (int *)(**(code **)(lVar6 + 0xd10))(local_1d0,0,8,0xc1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glMapNamedBufferRange have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                  ,0x86);
  (**(code **)(lVar6 + 0x340))(local_1cc,local_1d0,0,0,8);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  if (dVar5 != 0) {
    (**(code **)(lVar6 + 0x1678))(local_1d0);
    glu::checkError(dVar5,"glCopyNamedBufferSubData have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                    ,0x8f);
  }
  lVar7 = (**(code **)(lVar6 + 0x640))(0x9117,0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  if (dVar5 == 0) {
    iVar4 = (**(code **)(lVar6 + 0x228))(lVar7,1,16000000000);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    if (dVar5 != 0) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ClientWaitSync unexpectedly generated error ",0x2c);
      local_1c0.m_getName = glu::getErrorName;
      local_1c0.m_value = dVar5;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Tests fails.",0xe);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a29066:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      goto LAB_00a29082;
    }
    if ((iVar4 != 0x911a) && (iVar4 != 0x911c)) {
      bVar2 = false;
      if (iVar4 == 0x911b) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "ClientWaitSync with SYNC_FLUSH_COMMANDS_BIT flag has returned TIMEOUT_EXPIRED after "
                   ,0x54);
        std::ostream::_M_insert<long>((long)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   " nanoseconds. Potentially test may not be done in finite time which is expected (OpenGL 4.5 Core Profile, Chapter 4.1.2)."
                   ,0x79);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," However this cannot be proven in finite time. Test timeouts."
                   ,0x3d);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar2 = true;
      }
      goto LAB_00a29085;
    }
    bVar3 = true;
    if ((*local_1c8 != 3) && (local_1c8[1] != 0x159af7)) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Result data [",0xd);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"is not equal to the reference [",0x1f);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]. Tests fails.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00a29066;
    }
    bVar2 = false;
  }
  else {
LAB_00a29082:
    bVar2 = false;
LAB_00a29085:
    bVar3 = false;
  }
  (**(code **)(lVar6 + 0x1678))(local_1d0);
  glu::checkError(dVar5,"glUnmapNamedBuffer have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                  ,0xc3);
  if (local_1cc != 0) {
    (**(code **)(lVar6 + 0x438))(1);
  }
  if (local_1d0 != 0) {
    (**(code **)(lVar6 + 0x438))(1);
  }
  if (lVar7 != 0) {
    (**(code **)(lVar6 + 0x478))(lVar7);
  }
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  if (bVar2) {
    description = 
    "Timeout (Potentially, ClientWaitSync with SYNC_FLUSH_COMMANDS does not return in finite time)."
    ;
    testResult = QP_TEST_RESULT_TIMEOUT;
  }
  else if (bVar3) {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
LAB_00a2920a:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FlushCommandsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok		= false;
	bool is_error   = false;
	bool is_timeout = false;

	/* Test constants. */
	static const glw::GLuint reference[2]   = { 3, 1415927 };
	static const glw::GLuint reference_size = sizeof(reference);

	/* Test objects. */
	glw::GLuint buffer_src = 0;
	glw::GLuint buffer_dst = 0;
	glw::GLsync sync	   = 0;
	glw::GLenum error	  = GL_NO_ERROR;

	try
	{
		/* Prepare buffers. */
		gl.createBuffers(1, &buffer_src);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers have failed");
		gl.namedBufferData(buffer_src, reference_size, reference, GL_STATIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData have failed");

		gl.createBuffers(1, &buffer_dst);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers have failed");
		gl.namedBufferStorage(buffer_dst, reference_size, NULL,
							  GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferStorage have failed");

		/* Map perisistently buffer range. */
		glw::GLuint* data_dst = (glw::GLuint*)gl.mapNamedBufferRange(
			buffer_dst, 0, reference_size, GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBufferRange have failed");

		/* Copy data from source to destination buffer */
		gl.copyNamedBufferSubData(buffer_src, buffer_dst, 0, 0, reference_size);

		if (GL_NO_ERROR != (error = gl.getError()))
		{
			gl.unmapNamedBuffer(buffer_dst);

			GLU_EXPECT_NO_ERROR(error, "glCopyNamedBufferSubData have failed");
		}

		/* Create fence sync object. */
		sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);

		if (GL_NO_ERROR == (error = gl.getError()))
		{
			/* Wait until done. */
			glw::GLenum wait_result = gl.clientWaitSync(sync, GL_SYNC_FLUSH_COMMANDS_BIT, TEST_SYNC_WAIT_TIMEOUT);

			/* Check for error. */
			if (GL_NO_ERROR == (error = gl.getError()))
			{
				/* Check for timeout. */
				if (GL_TIMEOUT_EXPIRED == wait_result)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message
						<< "ClientWaitSync with SYNC_FLUSH_COMMANDS_BIT flag has returned TIMEOUT_EXPIRED after "
						<< TEST_SYNC_WAIT_TIMEOUT << " nanoseconds. Potentially test may not be done in finite time "
													 "which is expected (OpenGL 4.5 Core Profile, Chapter 4.1.2)."
						<< " However this cannot be proven in finite time. Test timeouts." << tcu::TestLog::EndMessage;

					is_timeout = true;
				} /* Check for proper wait result. */
				else if ((GL_CONDITION_SATISFIED == wait_result) || (GL_ALREADY_SIGNALED == wait_result))
				{
					/* Compare destination buffer data with reference. */
					if ((reference[0] == data_dst[0]) || (reference[1] == data_dst[1]))
					{
						is_ok = true;
					}
					else
					{
						m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result data [" << data_dst[0]
															<< ", " << data_dst[1] << "is not equal to the reference ["
															<< reference[0] << ", " << reference[1] << "]. Tests fails."
															<< tcu::TestLog::EndMessage;
					}
				}
			}
			else
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "ClientWaitSync unexpectedly generated error "
					<< glu::getErrorStr(error) << ". Tests fails." << tcu::TestLog::EndMessage;
			}
		}

		/* Unmapping. */
		gl.unmapNamedBuffer(buffer_dst);
		GLU_EXPECT_NO_ERROR(error, "glUnmapNamedBuffer have failed");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (buffer_src)
	{
		gl.deleteBuffers(1, &buffer_src);
	}

	if (buffer_dst)
	{
		gl.deleteBuffers(1, &buffer_dst);
	}

	if (sync)
	{
		gl.deleteSync(sync);
	}

	/* Result's setup. */
	if (is_timeout)
	{
		m_testCtx.setTestResult(
			QP_TEST_RESULT_TIMEOUT,
			"Timeout (Potentially, ClientWaitSync with SYNC_FLUSH_COMMANDS does not return in finite time).");
	}
	else
	{
		if (is_ok)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			if (is_error)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			}
		}
	}

	return STOP;
}